

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

CKeyID * GetKeyForDestination
                   (CKeyID *__return_storage_ptr__,SigningProvider *store,CTxDestination *dest)

{
  uchar *puVar1;
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *this;
  uint160 *puVar2;
  base_blob<160U> *pbVar3;
  __index_type _Var4;
  bool bVar5;
  int iVar6;
  uchar *puVar7;
  _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *p_Var8;
  long in_FS_OFFSET;
  CPubKey pub;
  CTxDestination inner_dest;
  CScriptID script_id;
  undefined1 local_108 [28];
  uint uStack_ec;
  undefined1 local_b8 [72];
  _Rb_tree_node_base local_70;
  undefined8 local_50;
  CScriptID local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var4 = (dest->
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ).
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_index;
  if (_Var4 == '\x05') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ToKeyID(__return_storage_ptr__,(WitnessV0KeyHash *)dest);
      return __return_storage_ptr__;
    }
    goto LAB_00749903;
  }
  if (_Var4 == '\x03') {
    local_108._16_8_ = 0;
    stack0xffffffffffffff10 = 0;
    local_108._0_8_ = (char *)0x0;
    local_108._8_8_ = 0;
    ToScriptID(&local_3c,(ScriptHash *)dest);
    local_b8._16_8_ = 0;
    local_b8._24_8_ = 0;
    local_b8._0_8_ = 0;
    local_b8._8_8_ = 0;
    local_70._M_color = local_70._M_color & 0xffffff00;
    iVar6 = (*store->_vptr_SigningProvider[2])(store,&local_3c,local_108);
    if ((char)iVar6 == '\0') {
LAB_00749799:
      std::__detail::__variant::
      _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)local_b8);
      if (0x1c < uStack_ec) {
        free((void *)local_108._0_8_);
      }
      _Var4 = (dest->
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ).
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_index;
      goto LAB_007497b7;
    }
    bVar5 = ExtractDestination((CScript *)local_108,(CTxDestination *)local_b8);
    if (!bVar5 || (undefined1)local_70._M_color != 5) goto LAB_00749799;
    ToKeyID(__return_storage_ptr__,(WitnessV0KeyHash *)local_b8);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_b8);
    if (0x1c < uStack_ec) {
      free((void *)local_108._0_8_);
    }
  }
  else {
    if (_Var4 == '\x02') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        ToKeyID(__return_storage_ptr__,(PKHash *)dest);
        return __return_storage_ptr__;
      }
      goto LAB_00749903;
    }
LAB_007497b7:
    if (_Var4 == '\x06') {
      local_70._M_left = &local_70;
      local_70._M_color = _S_red;
      local_70._M_parent = (_Base_ptr)0x0;
      local_b8._0_8_ = 0;
      local_b8._8_8_ = 0;
      local_b8._16_8_ = 0;
      local_b8._24_8_ = 0;
      local_b8._32_8_ = 0;
      local_b8._40_8_ = 0;
      local_b8._48_8_ = 0;
      local_b8._56_8_ = 0;
      local_50 = 0;
      local_108[0] = 0xff;
      local_70._M_right = local_70._M_left;
      iVar6 = (*store->_vptr_SigningProvider[8])(store,dest,local_b8);
      if ((char)iVar6 != '\0') {
        puVar1 = local_b8 + 0x20;
        puVar7 = std::
                 __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                           (local_b8,puVar1);
        if (puVar7 != puVar1) {
          this = (_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                  *)(local_b8 + 0x40);
          p_Var8 = (_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                    *)std::
                      __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                (puVar1,this);
          if ((p_Var8 == this) &&
             (bVar5 = SigningProvider::GetPubKeyByXOnly
                                (store,(XOnlyPubKey *)local_b8,(CPubKey *)local_108), bVar5)) {
            CPubKey::GetID(__return_storage_ptr__,(CPubKey *)local_108);
            std::
            _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
            ::~_Rb_tree(this);
            goto LAB_0074987d;
          }
        }
      }
      std::
      _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                   *)(local_b8 + 0x40));
    }
    puVar2 = &__return_storage_ptr__->super_uint160;
    (puVar2->super_base_blob<160U>).m_data._M_elems[0] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[1] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[2] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[3] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[4] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[5] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[6] = '\0';
    (puVar2->super_base_blob<160U>).m_data._M_elems[7] = '\0';
    pbVar3 = &(__return_storage_ptr__->super_uint160).super_base_blob<160U>;
    (pbVar3->m_data)._M_elems[8] = '\0';
    (pbVar3->m_data)._M_elems[9] = '\0';
    (pbVar3->m_data)._M_elems[10] = '\0';
    (pbVar3->m_data)._M_elems[0xb] = '\0';
    (pbVar3->m_data)._M_elems[0xc] = '\0';
    (pbVar3->m_data)._M_elems[0xd] = '\0';
    (pbVar3->m_data)._M_elems[0xe] = '\0';
    (pbVar3->m_data)._M_elems[0xf] = '\0';
    pbVar3 = &(__return_storage_ptr__->super_uint160).super_base_blob<160U>;
    (pbVar3->m_data)._M_elems[0x10] = '\0';
    (pbVar3->m_data)._M_elems[0x11] = '\0';
    (pbVar3->m_data)._M_elems[0x12] = '\0';
    (pbVar3->m_data)._M_elems[0x13] = '\0';
  }
LAB_0074987d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00749903:
  __stack_chk_fail();
}

Assistant:

CKeyID GetKeyForDestination(const SigningProvider& store, const CTxDestination& dest)
{
    // Only supports destinations which map to single public keys:
    // P2PKH, P2WPKH, P2SH-P2WPKH, P2TR
    if (auto id = std::get_if<PKHash>(&dest)) {
        return ToKeyID(*id);
    }
    if (auto witness_id = std::get_if<WitnessV0KeyHash>(&dest)) {
        return ToKeyID(*witness_id);
    }
    if (auto script_hash = std::get_if<ScriptHash>(&dest)) {
        CScript script;
        CScriptID script_id = ToScriptID(*script_hash);
        CTxDestination inner_dest;
        if (store.GetCScript(script_id, script) && ExtractDestination(script, inner_dest)) {
            if (auto inner_witness_id = std::get_if<WitnessV0KeyHash>(&inner_dest)) {
                return ToKeyID(*inner_witness_id);
            }
        }
    }
    if (auto output_key = std::get_if<WitnessV1Taproot>(&dest)) {
        TaprootSpendData spenddata;
        CPubKey pub;
        if (store.GetTaprootSpendData(*output_key, spenddata)
            && !spenddata.internal_key.IsNull()
            && spenddata.merkle_root.IsNull()
            && store.GetPubKeyByXOnly(spenddata.internal_key, pub)) {
            return pub.GetID();
        }
    }
    return CKeyID();
}